

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O0

int __thiscall
arealights::LinearlyTransformedCosines::init(LinearlyTransformedCosines *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  string *vertexShaderPath;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [16];
  LinearlyTransformedCosines *this_local;
  
  local_18._8_8_ = this;
  vertexShaderPath =
       (string *)
       std::__shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator->((__shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"../assets/LTC.vs.glsl",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"../assets/LTC.fs.glsl",&local_71);
  RenderHelper::makeSimpleShader((RenderHelper *)local_18,vertexShaderPath,&local_38);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::operator=
            (&this->_ltcShader,
             (unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_18);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_18);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  loadLookupTextures(this);
  return extraout_EAX;
}

Assistant:

void LinearlyTransformedCosines::init()
{
    _ltcShader = _renderHelper->makeSimpleShader(
        "../assets/LTC.vs.glsl",
        "../assets/LTC.fs.glsl"
    );

    loadLookupTextures();
}